

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O1

void __thiscall
libtorrent::anon_unknown_5::ut_metadata_peer_plugin::maybe_send_request
          (ut_metadata_peer_plugin *this)

{
  int iVar1;
  byte bVar2;
  ut_metadata_plugin *puVar3;
  pointer pmVar4;
  pointer pmVar5;
  iterator __position;
  char cVar6;
  int iVar7;
  int iVar8;
  time_point tVar9;
  pointer pmVar10;
  pointer pmVar11;
  long lVar12;
  pointer pmVar13;
  vector<metadata_piece> *this_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> this_01;
  bool bVar14;
  int piece;
  int local_3c;
  duration local_38;
  
  iVar7 = (*(this->m_pc->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])();
  if ((((((char)iVar7 == '\0') &&
        ((((this->m_torrent->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files
         ).m_piece_length < 1)) && (this->m_message_index != 0)) &&
      ((ulong)((long)(this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) < 5)) &&
     ((((this->m_pc->super_peer_connection).field_0x887 & 8) != 0 ||
      (tVar9 = aux::time_now(), (this->m_request_limit).__d.__r < (long)tVar9.__d.__r)))) {
    puVar3 = this->m_tp;
    pmVar4 = (puVar3->m_requested_metadata).
             super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             .
             super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pmVar5 = (puVar3->m_requested_metadata).
             super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             .
             super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pmVar10 = pmVar4 + 1;
    pmVar11 = pmVar4;
    pmVar13 = pmVar4;
    if (pmVar10 != pmVar5 && pmVar4 != pmVar5) {
      do {
        pmVar13 = pmVar10;
        if (pmVar11->num_requests <= pmVar10->num_requests) {
          pmVar13 = pmVar11;
        }
        pmVar10 = pmVar10 + 1;
        pmVar11 = pmVar13;
      } while (pmVar10 != pmVar5);
    }
    bVar2 = (this->m_pc->super_peer_connection).field_0x887;
    this_00 = &puVar3->m_requested_metadata;
    if (pmVar4 == pmVar5) {
      aux::
      container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
      ::resize<int,void>((container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
                          *)this_00,1);
      pmVar13 = (this_00->
                super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                ).
                super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    pmVar10 = (this_00->
              super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
              ).
              super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar7 = (int)((ulong)((long)pmVar13 - (long)pmVar10) >> 5);
    this_01._M_pi =
         pmVar10[iVar7].source.
         super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar8 = (this_01._M_pi)->_M_use_count;
      do {
        if (iVar8 == 0) {
          this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = (this_01._M_pi)->_M_use_count;
        bVar14 = iVar8 == iVar1;
        if (bVar14) {
          (this_01._M_pi)->_M_use_count = iVar8 + 1;
          iVar1 = iVar8;
        }
        iVar8 = iVar1;
        UNLOCK();
      } while (!bVar14);
    }
    if (this_01._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar14 = true;
    }
    else {
      bVar14 = (this_01._M_pi)->_M_use_count == 0;
    }
    if (bVar14) {
      lVar12 = 0;
    }
    else {
      lVar12 = *(long *)&pmVar10[iVar7].source.
                         super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    tVar9 = aux::time_now();
    if (((lVar12 == 0) ||
        (local_38 = tVar9.__d.__r, cVar6 = (**(code **)(**(long **)(lVar12 + 0x60) + 8))(),
        tVar9.__d.__r = (duration)(duration)local_38.__r, cVar6 != '\0')) ||
       (iVar8 = -1,
       2999999999 <
       local_38.__r -
       (rep)(this_00->
            super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
            ).
            super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar7].last_request.__d)) {
      pmVar4 = (this_00->
               super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
               ).
               super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pmVar10 = pmVar4 + iVar7;
      pmVar10->num_requests = pmVar10->num_requests + 1;
      iVar8 = iVar7;
      if ((bVar2 & 8) != 0) {
        pmVar4[iVar7].last_request.__d = tVar9.__d.__r;
      }
    }
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    }
    if (iVar8 != -1) {
      __position._M_current =
           (this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_3c = iVar8;
      if (__position._M_current ==
          (this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_sent_requests,__position,&local_3c);
      }
      else {
        *__position._M_current = iVar8;
        (this->m_sent_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      write_metadata_packet(this,request,local_3c);
    }
  }
  return;
}

Assistant:

void maybe_send_request()
		{
			if (m_pc.is_disconnecting()) return;

			// if we don't have any metadata, and this peer
			// supports the request metadata extension
			// and we aren't currently waiting for a request
			// reply. Then, send a request for some metadata.
			if (!m_torrent.valid_metadata()
				&& m_message_index != 0
				&& m_sent_requests.size() < 2
				&& has_metadata())
			{
				int const piece = m_tp.metadata_request(m_pc.has_metadata());
				if (piece == -1) return;

				m_sent_requests.push_back(piece);
				write_metadata_packet(msg_t::request, piece);
			}
		}